

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::BitwiseXor(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                    uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                    uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong *in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  ulong *in_R8;
  ulong *in_R9;
  uint8_t *outXEnd;
  simd *dst;
  simd *src2;
  simd *src1;
  byte *local_130;
  byte *local_128;
  byte *local_120;
  ulong *local_110;
  ulong *local_108;
  ulong *local_100;
  ulong *local_f8;
  ulong *local_f0;
  ulong *local_e8;
  
  local_f0 = in_R8;
  local_e8 = in_RCX;
  for (local_f8 = in_R9; local_f8 != (ulong *)outXEnd;
      local_f8 = (ulong *)((long)local_f8 + (ulong)in_EDX)) {
    local_108 = local_f0;
    local_110 = local_f8;
    for (local_100 = local_e8; local_100 != local_e8 + ((ulong)outYEnd & 0xffffffff) * 4;
        local_100 = local_100 + 4) {
      uVar1 = local_100[1];
      uVar2 = local_100[2];
      uVar3 = local_100[3];
      uVar4 = local_108[1];
      uVar5 = local_108[2];
      uVar6 = local_108[3];
      *local_110 = *local_100 ^ *local_108;
      local_110[1] = uVar1 ^ uVar4;
      local_110[2] = uVar2 ^ uVar5;
      local_110[3] = uVar3 ^ uVar6;
      local_108 = local_108 + 4;
      local_110 = local_110 + 4;
    }
    if (totalSimdWidth != 0) {
      local_120 = (byte *)((long)local_e8 + (ulong)simdWidth);
      local_128 = (byte *)((long)local_f0 + (ulong)simdWidth);
      local_130 = (byte *)((long)local_f8 + (ulong)simdWidth);
      pbVar7 = local_130 + totalSimdWidth;
      for (; local_130 != pbVar7; local_130 = local_130 + 1) {
        *local_130 = *local_120 ^ *local_128;
        local_120 = local_120 + 1;
        local_128 = local_128 + 1;
      }
    }
    local_e8 = (ulong *)((long)local_e8 + (ulong)in_EDI);
    local_f0 = (ulong *)((long)local_f0 + (ulong)in_ESI);
  }
  return;
}

Assistant:

void BitwiseXor( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                     uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst )
                _mm256_storeu_si256( dst, _mm256_xor_si256( _mm256_loadu_si256( src1 ), _mm256_loadu_si256( src2 ) ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                    (*outX) = (*in1X) ^ (*in2X);
            }
        }
    }